

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O2

void poly1305_whole_block(void *vctx,uint8_t *buf)

{
  int i;
  long lVar1;
  uint32_t c [17];
  uint32_t local_48 [16];
  undefined4 local_8;
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    local_48[lVar1] = (uint)buf[lVar1];
  }
  local_8 = 1;
  poly1305_block((cf_poly1305 *)vctx,local_48);
  return;
}

Assistant:

static void poly1305_whole_block(void *vctx,
                                 const uint8_t *buf)
{
  cf_poly1305 *ctx = vctx;
  uint32_t c[17];
  int i;

  for (i = 0; i < 16; i++)
    c[i] = buf[i];

  c[16] = 1;
  poly1305_block(ctx, c);
}